

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

int __thiscall
FNodeBuilder::FVertexMapSimple::SelectVertexExact(FVertexMapSimple *this,FPrivVert *vert)

{
  uint uVar1;
  ulong uVar2;
  fixed_t *pfVar3;
  
  pfVar3 = &(((this->MyBuilder->Vertices).Array)->super_FSimpleVert).y;
  uVar2 = 0;
  while( true ) {
    if ((this->MyBuilder->Vertices).Count == uVar2) {
      vert->segs = 0xffffffff;
      vert->segs2 = 0xffffffff;
      uVar1 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Push
                        (&this->MyBuilder->Vertices,vert);
      return uVar1;
    }
    if ((((FSimpleVert *)(pfVar3 + -1))->x == (vert->super_FSimpleVert).x) &&
       (*pfVar3 == (vert->super_FSimpleVert).y)) break;
    uVar2 = uVar2 + 1;
    pfVar3 = pfVar3 + 4;
  }
  return (int)uVar2;
}

Assistant:

int FNodeBuilder::FVertexMapSimple::SelectVertexExact(FNodeBuilder::FPrivVert &vert)
{
	FPrivVert *verts = &MyBuilder.Vertices[0];
	unsigned int stop = MyBuilder.Vertices.Size();

	for (unsigned int i = 0; i < stop; ++i)
	{
		if (verts[i].x == vert.x && verts[i].y == vert.y)
		{
			return i;
		}
	}
	// Not present: add it!
	return InsertVertex(vert);
}